

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double dipole_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = x * x + 1.0;
  dVar4 = dVar3 * 3.141592653589793;
  dVar1 = cos(a + a);
  dVar2 = sin(x + x);
  return ((dVar2 * (x + x) + dVar1 * (1.0 - x * x)) * b * b) / (dVar4 * dVar3) + 1.0 / dVar4;
}

Assistant:

double dipole_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    DIPOLE_PDF evaluates the Dipole PDF.
//
//  Discussion:
//
//    PDF(A,B;X) =
//        1 / ( PI * ( 1 + X^2 ) )
//      + B^2 * ( ( 1 - X^2 ) * cos ( 2 * A ) + 2.0 * X * sin ( 2 * A ) )
//      / ( PI * ( 1 + X )^2 )
//
//    Densities of this kind commonly occur in the analysis of resonant
//    scattering of elementary particles.
//
//    DIPOLE_PDF(A,0;X) = CAUCHY_PDF(A;X)
//    A = 0, B = 1 yields the single channel dipole distribution.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Knop,
//    Algorithm 441,
//    ACM Transactions on Mathematical Software.
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    A is arbitrary, but represents an angle, so only 0 <= A <= 2 * PI
//      is interesting,
//    and -1.0 <= B <= 1.0.
//
//    Output, double DIPOLE_PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;

  pdf = 1.0 / ( r8_pi * ( 1.0 + x * x ) )
    + b * b * ( ( 1.0 - x * x ) * cos ( 2.0 * a )
    + 2.0 * x * sin ( 2.0 * x ) )
    / ( r8_pi * ( 1.0 + x * x ) * ( 1.0 + x * x ) );

  return pdf;
}